

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall
kj::BufferedOutputStreamWrapper::write
          (BufferedOutputStreamWrapper *this,int __fd,void *__buf,size_t __n)

{
  byte *pbVar1;
  OutputStream *pOVar2;
  size_t sVar3;
  int iVar4;
  uchar *puVar5;
  size_t sVar6;
  uchar *__src;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> AVar7;
  uchar *local_80;
  size_t local_78;
  ArrayPtr<unsigned_char> local_70;
  ArrayPtr<const_unsigned_char> local_60;
  ArrayPtr<const_unsigned_char> local_50;
  ArrayPtr<const_unsigned_char> local_40;
  ulong local_30;
  size_t available;
  size_t size;
  BufferedOutputStreamWrapper *this_local;
  ArrayPtr<const_unsigned_char> src_local;
  
  this_local = (BufferedOutputStreamWrapper *)CONCAT44(in_register_00000034,__fd);
  size = (size_t)this;
  src_local.ptr = (uchar *)__buf;
  available = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  puVar5 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
  if (puVar5 == this->bufferPos) {
    this->bufferPos = this->bufferPos + available;
  }
  else {
    puVar5 = ArrayPtr<unsigned_char>::end(&this->buffer);
    sVar3 = available;
    local_30 = (long)puVar5 - (long)this->bufferPos;
    if (local_30 < available) {
      sVar6 = ArrayPtr<unsigned_char>::size(&this->buffer);
      if (sVar6 < sVar3) {
        pOVar2 = this->inner;
        pbVar1 = this->bufferPos;
        puVar5 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        local_70 = ArrayPtr<unsigned_char>::slice(&this->buffer,0,(long)pbVar1 - (long)puVar5);
        local_60 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_70);
        (*pOVar2->_vptr_OutputStream[2])(pOVar2,local_60.ptr,local_60.size_);
        puVar5 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        this->bufferPos = puVar5;
        pOVar2 = this->inner;
        AVar7 = ArrayPtr<const_unsigned_char>::first
                          ((ArrayPtr<const_unsigned_char> *)&this_local,available);
        local_80 = AVar7.ptr;
        local_78 = AVar7.size_;
        iVar4 = (*pOVar2->_vptr_OutputStream[2])(pOVar2,local_80,local_78);
        this = (BufferedOutputStreamWrapper *)CONCAT44(extraout_var,iVar4);
      }
      else {
        pbVar1 = this->bufferPos;
        puVar5 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
        memcpy(pbVar1,puVar5,local_30);
        pOVar2 = this->inner;
        local_40 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&this->buffer);
        (*pOVar2->_vptr_OutputStream[2])(pOVar2,local_40.ptr,local_40.size_);
        available = available - local_30;
        local_50 = ArrayPtr<const_unsigned_char>::slice
                             ((ArrayPtr<const_unsigned_char> *)&this_local,local_30);
        this_local = (BufferedOutputStreamWrapper *)local_50.ptr;
        src_local.ptr = (uchar *)local_50.size_;
        puVar5 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        __src = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
        memcpy(puVar5,__src,available);
        puVar5 = ArrayPtr<unsigned_char>::begin(&this->buffer);
        this->bufferPos = puVar5 + available;
      }
    }
    else {
      pbVar1 = this->bufferPos;
      puVar5 = ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&this_local);
      memcpy(pbVar1,puVar5,available);
      this->bufferPos = this->bufferPos + available;
    }
  }
  return (ssize_t)this;
}

Assistant:

void BufferedOutputStreamWrapper::write(ArrayPtr<const byte> src) {
  auto size = src.size();
  if (src.begin() == bufferPos) {
    // Oh goody, the caller wrote directly into our buffer.
    bufferPos += size;
  } else {
    size_t available = buffer.end() - bufferPos;

    if (size <= available) {
      memcpy(bufferPos, src.begin(), size);
      bufferPos += size;
    } else if (size <= buffer.size()) {
      // Too much for this buffer, but not a full buffer's worth, so we'll go ahead and copy.
      memcpy(bufferPos, src.begin(), available);
      inner.write(buffer);

      size -= available;
      src = src.slice(available);

      memcpy(buffer.begin(), src.begin(), size);
      bufferPos = buffer.begin() + size;
    } else {
      // Writing so much data that we might as well write directly to avoid a copy.
      inner.write(buffer.slice(0, bufferPos - buffer.begin()));
      bufferPos = buffer.begin();
      inner.write(src.first(size));
    }
  }
}